

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O3

void __thiscall Ptex::v2_2::StringKey::StringKey(StringKey *this,char *val)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  uint64_t val64 [4];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  long local_48 [4];
  
  this->_val = val;
  sVar3 = strlen(val);
  this->_len = (uint32_t)sVar3;
  pcVar8 = this->_val;
  uVar5 = this->_len;
  local_48[0] = 0;
  memcpy(local_48,pcVar8 + ((long)(int)uVar5 & 0xfffffffffffffff8U),(ulong)(uVar5 & 7));
  local_58 = (undefined1  [16])0x0;
  local_68._0_8_ = local_48[0] * 0x1000193;
  local_68._8_8_ = 0;
  if ((int)((long)(int)uVar5 & 0xfffffffffffffff8U) < 0x20) {
    uVar5 = 0;
    uVar7 = 0;
  }
  else {
    uVar4 = 0;
    do {
      lVar6 = 0;
      do {
        uVar1 = *(ulong *)((long)(pcVar8 + lVar6 * 8) + 8);
        uVar2 = *(ulong *)(local_68 + lVar6 * 8 + 8);
        *(ulong *)(local_68 + lVar6 * 8) =
             ((*(ulong *)(local_68 + lVar6 * 8) >> 0x20) * 0x1000193 << 0x20) +
             (*(ulong *)(local_68 + lVar6 * 8) & 0xffffffff) * 0x1000193 ^
             *(ulong *)(pcVar8 + lVar6 * 8);
        *(ulong *)(local_68 + lVar6 * 8 + 8) =
             ((uVar2 >> 0x20) * 0x1000193 << 0x20) + (uVar2 & 0xffffffff) * 0x1000193 ^ uVar1;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 4);
      uVar4 = uVar4 + 1;
      pcVar8 = pcVar8 + 0x20;
    } while (uVar4 != (uVar5 - 0x20 >> 5) + 1);
    uVar5 = local_68._8_4_;
    uVar7 = local_58._0_4_ * 0x1000193 ^ local_58._8_4_;
  }
  this->_hash = uVar7 ^ (uVar5 ^ (int)local_68._0_8_ * 0x1000193) * 0x1000193;
  this->_ownsVal = false;
  return;
}

Assistant:

StringKey(const char* val)
    {
        _val = val;
        _len = uint32_t(strlen(val));
        _hash = memHash(_val, _len);
        _ownsVal = false;
    }